

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O1

realtype N_VMin_SensWrapper(N_Vector x)

{
  long *plVar1;
  long lVar2;
  realtype rVar3;
  realtype rVar4;
  
  rVar3 = N_VMin((N_Vector)**x->content);
  plVar1 = (long *)x->content;
  if (1 < (int)plVar1[1]) {
    lVar2 = 1;
    rVar4 = rVar3;
    do {
      rVar3 = N_VMin(*(N_Vector *)(*plVar1 + lVar2 * 8));
      if (rVar4 <= rVar3) {
        rVar3 = rVar4;
      }
      lVar2 = lVar2 + 1;
      plVar1 = (long *)x->content;
      rVar4 = rVar3;
    } while (lVar2 < (int)plVar1[1]);
  }
  return rVar3;
}

Assistant:

realtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  realtype min, tmp;

  min = N_VMin(NV_VEC_SW(x,0));

  for (i=1; i < NV_NVECS_SW(x); i++) {
    tmp = N_VMin(NV_VEC_SW(x,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}